

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_opt.c
# Opt level: O0

void ZSTD_optLdm_processMatchCandidate
               (ZSTD_optLdm_t *optLdm,ZSTD_match_t *matches,U32 *nbMatches,U32 currPosInBlock,
               U32 remainingBytes)

{
  U32 posOvershoot;
  U32 remainingBytes_local;
  U32 currPosInBlock_local;
  U32 *nbMatches_local;
  ZSTD_match_t *matches_local;
  ZSTD_optLdm_t *optLdm_local;
  
  if (((optLdm->seqStore).size != 0) && ((optLdm->seqStore).pos < (optLdm->seqStore).size)) {
    if (optLdm->endPosInBlock <= currPosInBlock) {
      if (optLdm->endPosInBlock < currPosInBlock) {
        ZSTD_optLdm_skipRawSeqStoreBytes
                  (&optLdm->seqStore,(ulong)(currPosInBlock - optLdm->endPosInBlock));
      }
      ZSTD_opt_getNextMatchAndUpdateSeqStore(optLdm,currPosInBlock,remainingBytes);
    }
    ZSTD_optLdm_maybeAddMatch(matches,nbMatches,optLdm,currPosInBlock);
  }
  return;
}

Assistant:

static void
ZSTD_optLdm_processMatchCandidate(ZSTD_optLdm_t* optLdm,
                                  ZSTD_match_t* matches, U32* nbMatches,
                                  U32 currPosInBlock, U32 remainingBytes)
{
    if (optLdm->seqStore.size == 0 || optLdm->seqStore.pos >= optLdm->seqStore.size) {
        return;
    }

    if (currPosInBlock >= optLdm->endPosInBlock) {
        if (currPosInBlock > optLdm->endPosInBlock) {
            /* The position at which ZSTD_optLdm_processMatchCandidate() is called is not necessarily
             * at the end of a match from the ldm seq store, and will often be some bytes
             * over beyond matchEndPosInBlock. As such, we need to correct for these "overshoots"
             */
            U32 const posOvershoot = currPosInBlock - optLdm->endPosInBlock;
            ZSTD_optLdm_skipRawSeqStoreBytes(&optLdm->seqStore, posOvershoot);
        }
        ZSTD_opt_getNextMatchAndUpdateSeqStore(optLdm, currPosInBlock, remainingBytes);
    }
    ZSTD_optLdm_maybeAddMatch(matches, nbMatches, optLdm, currPosInBlock);
}